

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,FunctionCallStmt *stmt)

{
  add_info(this,&stmt->super_Stmt);
  return;
}

Assistant:

void inline visit(FunctionCallStmt *stmt) override { add_info(stmt); }